

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactorRational::factor(CLUFactorRational *this,SVectorRational **vec,Rational *threshold)

{
  bool bVar1;
  int iVar2;
  
  (*this->factorTime->_vptr_Timer[3])();
  this->stat = OK;
  *(this->l).start = 0;
  (this->l).firstUpdate = 0;
  (this->l).firstUnused = 0;
  Temp::init(&this->temp,(EVP_PKEY_CTX *)(ulong)(uint)this->thedim);
  initPerm(this);
  initFactorMatrix(this,vec);
  if (this->stat == OK) {
    bVar1 = timeLimitReached(this);
    if (!bVar1) {
      colSingletons(this);
      if (this->stat != OK) goto LAB_0019e6f4;
      bVar1 = timeLimitReached(this);
      if (!bVar1) {
        rowSingletons(this);
        if (this->stat != OK) goto LAB_0019e6f4;
        if ((this->temp).stage < this->thedim) {
          bVar1 = timeLimitReached(this);
          if (!bVar1) {
            initFactorRings(this);
            eliminateNucleus(this,threshold);
            freeFactorRings(this);
          }
        }
      }
    }
    (this->l).firstUpdate = (this->l).firstUnused;
    if (this->stat == OK) {
      setupRowVals(this);
      iVar2 = setupColVals(this);
      this->nzCnt = iVar2;
    }
  }
  else {
LAB_0019e6f4:
    (this->l).firstUpdate = (this->l).firstUnused;
  }
  (*this->factorTime->_vptr_Timer[4])();
  this->factorCount = this->factorCount + 1;
  return;
}

Assistant:

inline void CLUFactorRational::factor(
   const SVectorRational** vec,         ///< Array of column vector pointers
   const Rational& threshold            ///< pivoting threshold
)
{
   SPxOut::debug(this, "CLUFactorRational::factor()\n");

   factorTime->start();

   stat = SLinSolverRational::OK;

   l.start[0]    = 0;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   temp.init(thedim);
   initPerm();

   initFactorMatrix(vec);

   if(stat)
      goto TERMINATE;

   if(timeLimitReached())
      goto TERMINATE;

   //   initMaxabs = initMaxabs;

   colSingletons();

   if(stat != SLinSolverRational::OK)
      goto TERMINATE;

   if(timeLimitReached())
      goto TERMINATE;

   rowSingletons();

   if(stat != SLinSolverRational::OK)
      goto TERMINATE;

   if(temp.stage < thedim)
   {
      if(timeLimitReached())
         goto TERMINATE;

      initFactorRings();
      eliminateNucleus(threshold);
      freeFactorRings();
   }

TERMINATE:

   l.firstUpdate = l.firstUnused;

   if(stat == SLinSolverRational::OK)
   {
#ifdef SOPLEX_WITH_L_ROWS
      setupRowVals();
#endif
      nzCnt = setupColVals();
   }

   factorTime->stop();

   factorCount++;
}